

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::SequenceConcatExpr::Element>::
emplaceRealloc<slang::ast::SequenceConcatExpr::Element>
          (SmallVectorBase<slang::ast::SequenceConcatExpr::Element> *this,pointer pos,Element *args)

{
  undefined8 *puVar1;
  SourceLocation *pSVar2;
  undefined8 *puVar3;
  ulong uVar4;
  pointer p;
  size_type sVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  SourceLocation SVar8;
  undefined8 uVar9;
  pointer pEVar10;
  pointer pEVar11;
  uint32_t uVar12;
  _Storage<unsigned_int,_true> _Var13;
  pointer pEVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  
  if (this->len == 0x333333333333333) {
    detail::throwLengthError();
  }
  uVar16 = this->len + 1;
  uVar4 = this->cap;
  if (uVar16 < uVar4 * 2) {
    uVar16 = uVar4 * 2;
  }
  if (0x333333333333333 - uVar4 < uVar4) {
    uVar16 = 0x333333333333333;
  }
  lVar17 = (long)pos - (long)this->data_;
  pEVar14 = (pointer)operator_new(uVar16 * 0x28);
  *(AssertionExpr **)((long)pEVar14 + lVar17 + 0x20) = (args->sequence).ptr;
  uVar6 = *(undefined8 *)&args->delay;
  uVar7 = *(undefined8 *)
           &(args->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged;
  SVar8 = (args->delayRange).endLoc;
  pSVar2 = (SourceLocation *)((long)pEVar14 + lVar17 + 0x10);
  *pSVar2 = (args->delayRange).startLoc;
  pSVar2[1] = SVar8;
  *(undefined8 *)((long)pEVar14 + lVar17) = uVar6;
  ((undefined8 *)((long)pEVar14 + lVar17))[1] = uVar7;
  p = this->data_;
  sVar5 = this->len;
  lVar15 = (long)p + (sVar5 * 0x28 - (long)pos);
  pEVar10 = p;
  pEVar11 = pEVar14;
  if (lVar15 == 0) {
    if (sVar5 != 0) {
      lVar15 = 0;
      do {
        *(undefined8 *)((long)&(pEVar14->sequence).ptr + lVar15) =
             *(undefined8 *)((long)&(p->sequence).ptr + lVar15);
        puVar1 = (undefined8 *)((long)&(p->delay).min + lVar15);
        uVar6 = *puVar1;
        uVar7 = puVar1[1];
        puVar1 = (undefined8 *)(&(p->delayRange).startLoc.field_0x0 + lVar15);
        uVar9 = puVar1[1];
        puVar3 = (undefined8 *)(&(pEVar14->delayRange).startLoc.field_0x0 + lVar15);
        *puVar3 = *puVar1;
        puVar3[1] = uVar9;
        puVar1 = (undefined8 *)((long)&(pEVar14->delay).min + lVar15);
        *puVar1 = uVar6;
        puVar1[1] = uVar7;
        lVar15 = lVar15 + 0x28;
      } while (sVar5 * 0x28 != lVar15);
    }
  }
  else {
    for (; pEVar10 != pos; pEVar10 = pEVar10 + 1) {
      (pEVar11->sequence).ptr = (pEVar10->sequence).ptr;
      uVar12 = (pEVar10->delay).min;
      _Var13 = (pEVar10->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_payload;
      uVar6 = *(undefined8 *)
               &(pEVar10->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int>._M_engaged;
      SVar8 = (pEVar10->delayRange).endLoc;
      (pEVar11->delayRange).startLoc = (pEVar10->delayRange).startLoc;
      (pEVar11->delayRange).endLoc = SVar8;
      (pEVar11->delay).min = uVar12;
      (pEVar11->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload = _Var13;
      *(undefined8 *)
       &(pEVar11->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged = uVar6;
      pEVar11 = pEVar11 + 1;
    }
    memcpy((void *)((long)pEVar14 + lVar17 + 0x28),pos,((lVar15 - 0x28U) / 0x28) * 0x28 + 0x28);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar16;
  this->data_ = pEVar14;
  return (pointer)((long)pEVar14 + lVar17);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}